

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O2

Ref __thiscall trun::TestModule::TestCaseFromName(TestModule *this,string *caseName)

{
  __shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  __shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Ref RVar5;
  
  p_Var1 = (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)
           caseName[0xb].field_2._M_allocated_capacity;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  for (p_Var4 = (__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)
                caseName[0xb]._M_string_length; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var4);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (this->_vptr_TestModule + 8),in_RDX);
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if (_Var2) goto LAB_0010e7d2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->state);
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
  }
  this->_vptr_TestModule = (_func_int **)0x0;
  *(undefined8 *)&this->state = 0;
LAB_0010e7d2:
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ref)RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestFunc::Ref TestModule::TestCaseFromName(const std::string &caseName) const {
    for (auto func: testFuncs) {
        if (func->CaseName() == caseName) {
            return func;
        }
    }
    return nullptr;
}